

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bundle.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Bundle::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Bundle *this)

{
  pointer pKVar1;
  ostream *this_00;
  pointer pKVar2;
  KStringStream ss;
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::operator<<(local_1a0,"***************************************************************");
  this_00 = std::operator<<(local_1a0,"PDU Bundle.\nTotal Length: ");
  std::ostream::operator<<(this_00,this->m_ui16Length);
  std::operator<<(local_1a0,"***************************************************************");
  pKVar1 = (this->m_vRefHeaders).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar2 = (this->m_vRefHeaders).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar2 != pKVar1; pKVar2 = pKVar2 + 1) {
    (*(pKVar2->m_pRef->super_Header6)._vptr_Header6[2])(local_1d0);
    std::operator<<(local_1a0,local_1d0);
    std::__cxx11::string::~string(local_1d0);
  }
  std::operator<<(local_1a0,"***************************************************************");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

KString Bundle::GetAsString()
{
    KStringStream ss;

    ss << "***************************************************************";
    ss << "PDU Bundle.\nTotal Length: " << m_ui16Length;
    ss << "***************************************************************";

    // We only print the PDU, no point in printing the streams.

    //vector<KDataStream>::const_iterator citrObj = m_vStreams.begin();
    //vector<KDataStream>::const_iterator citrObjEnd = m_vStreams.end();
    //for( ; citrObj != citrObjEnd; ++citrObj )
    //{
    //	ss << citrObj->GetAsString();
    //}

    vector<PduPtr>::const_iterator citrRef = m_vRefHeaders.begin();
    vector<PduPtr>::const_iterator citrRefEnd = m_vRefHeaders.end();
    for( ; citrRef != citrRefEnd; ++citrRef )
    {
        ss << ( *citrRef )->GetAsString();
    }

    ss << "***************************************************************";

    return ss.str();
}